

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAabbUtil2.h
# Opt level: O0

void btTransformAabb(btVector3 *localAabbMin,btVector3 *localAabbMax,btScalar margin,
                    btTransform *trans,btVector3 *aabbMinOut,btVector3 *aabbMaxOut)

{
  btVector3 *pbVar1;
  btVector3 *this;
  undefined8 *in_RCX;
  btTransform *in_RDX;
  undefined8 *in_R8;
  btVector3 bVar2;
  btVector3 extent;
  btVector3 center;
  btMatrix3x3 abs_b;
  btVector3 localCenter;
  btVector3 localHalfExtents;
  btVector3 *in_stack_fffffffffffffec8;
  btScalar *in_stack_fffffffffffffed0;
  btVector3 *in_stack_fffffffffffffed8;
  btMatrix3x3 *this_00;
  btVector3 *in_stack_fffffffffffffee0;
  btVector3 *this_01;
  btVector3 *in_stack_fffffffffffffef8;
  btTransform *in_stack_ffffffffffffff00;
  btMatrix3x3 *in_stack_ffffffffffffff20;
  btMatrix3x3 local_b8;
  undefined8 local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined8 local_74;
  undefined8 local_6c;
  btVector3 local_64;
  undefined8 local_54;
  undefined8 local_4c;
  undefined4 local_44;
  btVector3 local_40;
  undefined8 *local_30;
  undefined8 *local_28;
  btTransform *local_20;
  btScalar local_14 [5];
  
  local_44 = 0x3f000000;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  bVar2 = operator-(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_4c = bVar2.m_floats._8_8_;
  local_54 = bVar2.m_floats._0_8_;
  bVar2 = operator*(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_40.m_floats._8_8_ = bVar2.m_floats._8_8_;
  local_40.m_floats._0_8_ = bVar2.m_floats._0_8_;
  pbVar1 = &local_64;
  btVector3::btVector3(pbVar1,local_14,local_14,local_14);
  this_01 = &local_40;
  btVector3::operator+=(this_01,pbVar1);
  local_78 = 0x3f000000;
  bVar2 = operator+(this_01,in_stack_fffffffffffffed8);
  local_80 = bVar2.m_floats._8_8_;
  local_88 = bVar2.m_floats._0_8_;
  bVar2 = operator*(pbVar1->m_floats,in_stack_fffffffffffffec8);
  local_6c = bVar2.m_floats._8_8_;
  local_74 = bVar2.m_floats._0_8_;
  btTransform::getBasis(local_20);
  this_00 = &local_b8;
  btMatrix3x3::absolute(in_stack_ffffffffffffff20);
  btTransform::operator()(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  pbVar1 = btMatrix3x3::operator[](this_00,0);
  this = btMatrix3x3::operator[](this_00,1);
  btMatrix3x3::operator[](this_00,2);
  btVector3::dot3(this,pbVar1,this_01,this_00->m_el);
  bVar2 = operator-(this_01,this_00->m_el);
  *local_28 = bVar2.m_floats._0_8_;
  local_28[1] = bVar2.m_floats._8_8_;
  bVar2 = operator+(this_01,this_00->m_el);
  *local_30 = bVar2.m_floats._0_8_;
  local_30[1] = bVar2.m_floats._8_8_;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void btTransformAabb(const btVector3& localAabbMin,const btVector3& localAabbMax, btScalar margin,const btTransform& trans,btVector3& aabbMinOut,btVector3& aabbMaxOut)
{
		btAssert(localAabbMin.getX() <= localAabbMax.getX());
		btAssert(localAabbMin.getY() <= localAabbMax.getY());
		btAssert(localAabbMin.getZ() <= localAabbMax.getZ());
		btVector3 localHalfExtents = btScalar(0.5)*(localAabbMax-localAabbMin);
		localHalfExtents+=btVector3(margin,margin,margin);

		btVector3 localCenter = btScalar(0.5)*(localAabbMax+localAabbMin);
		btMatrix3x3 abs_b = trans.getBasis().absolute();  
		btVector3 center = trans(localCenter);
        btVector3 extent = localHalfExtents.dot3( abs_b[0], abs_b[1], abs_b[2] );
		aabbMinOut = center-extent;
		aabbMaxOut = center+extent;
}